

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O1

int32_t __thiscall icu_63::IndianCalendar::handleGetExtendedYear(IndianCalendar *this)

{
  int32_t *piVar1;
  UCalendarDateFields UVar2;
  int32_t iVar3;
  int32_t *piVar4;
  
  iVar3 = 1;
  UVar2 = Calendar::newerField(&this->super_Calendar,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  piVar1 = (this->super_Calendar).fStamp + 0x13;
  piVar4 = (this->super_Calendar).fFields + 0x13;
  if (UVar2 != UCAL_EXTENDED_YEAR) {
    piVar4 = (this->super_Calendar).fFields + 1;
    piVar1 = (this->super_Calendar).fStamp + 1;
  }
  if (0 < *piVar1) {
    iVar3 = *piVar4;
  }
  return iVar3;
}

Assistant:

int32_t IndianCalendar::handleGetExtendedYear() {
    int32_t year;

    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        year = internalGet(UCAL_YEAR, 1); // Default to year 1
    }

    return year;
}